

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

bool __thiscall chatra::Thread::restoreTemporaryLock(Thread *this)

{
  bool bVar1;
  reference pRVar2;
  Reference ref;
  iterator __end1;
  iterator __begin1;
  vector<chatra::Reference,_std::allocator<chatra::Reference>_> *__range1;
  vector<chatra::Reference,_std::allocator<chatra::Reference>_> temp;
  value_type *f;
  Thread *this_local;
  
  temp.super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
  Lock::getTemporary((vector<chatra::Reference,_std::allocator<chatra::Reference>_> *)&__range1,
                     ((reference)
                     temp.super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->lock);
  __end1 = std::vector<chatra::Reference,_std::allocator<chatra::Reference>_>::begin
                     ((vector<chatra::Reference,_std::allocator<chatra::Reference>_> *)&__range1);
  ref.node = (ReferenceNode *)
             std::vector<chatra::Reference,_std::allocator<chatra::Reference>_>::end
                       ((vector<chatra::Reference,_std::allocator<chatra::Reference>_> *)&__range1);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<chatra::Reference_*,_std::vector<chatra::Reference,_std::allocator<chatra::Reference>_>_>
                                *)&ref);
    if (!bVar1) {
      Lock::temporaryLockRestored
                ((Lock *)temp.
                         super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage[9].node);
      std::
      vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
      ::pop_back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                  *)(temp.super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0xf));
      this_local._7_1_ = true;
LAB_0020e95a:
      std::vector<chatra::Reference,_std::allocator<chatra::Reference>_>::~vector
                ((vector<chatra::Reference,_std::allocator<chatra::Reference>_> *)&__range1);
      return this_local._7_1_;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<chatra::Reference_*,_std::vector<chatra::Reference,_std::allocator<chatra::Reference>_>_>
             ::operator*(&__end1);
    bVar1 = lockReference(this,pRVar2->node,Temporary);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_0020e95a;
    }
    __gnu_cxx::
    __normal_iterator<chatra::Reference_*,_std::vector<chatra::Reference,_std::allocator<chatra::Reference>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Thread::restoreTemporaryLock() {
	auto& f = frames.back();
	auto temp = f.lock->getTemporary();
	for (auto ref : temp) {
		if (!lockReference(ref, LockType::Temporary))
			return false;
	}
	f.lock->temporaryLockRestored();
	f.stack.pop_back();
	return true;
}